

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  int overflow;
  secp256k1_scalar term;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  int local_8e4;
  secp256k1_scalar local_8e0;
  secp256k1_strauss_state local_8c0;
  secp256k1_gej local_8a8;
  secp256k1_fe local_828 [8];
  secp256k1_ge local_6e8 [8];
  secp256k1_strauss_point_state local_428;
  
  local_8e4 = 0;
  secp256k1_scalar_set_b32(&local_8e0,tweak32,&local_8e4);
  iVar1 = 0;
  if (local_8e4 == 0) {
    local_8a8.infinity = p->infinity;
    local_8a8.x.n[0] = (p->x).n[0];
    local_8a8.x.n[1] = (p->x).n[1];
    local_8a8.x.n[2] = (p->x).n[2];
    local_8a8.x.n[3] = (p->x).n[3];
    local_8a8.x.n[4] = (p->x).n[4];
    local_8a8.y.n[0] = (p->y).n[0];
    local_8a8.y.n[1] = (p->y).n[1];
    local_8a8.y.n[2] = (p->y).n[2];
    local_8a8.y.n[3] = (p->y).n[3];
    local_8a8.y.n[4] = (p->y).n[4];
    local_8a8.z.n[0] = 1;
    local_8a8.z.n[1] = 0;
    local_8a8.z.n[2] = 0;
    local_8a8.z.n[3] = 0;
    local_8a8.z.n[4] = 0;
    local_8c0.aux = local_828;
    local_8c0.pre_a = local_6e8;
    local_8c0.ps = &local_428;
    secp256k1_ecmult_strauss_wnaf
              (&local_8c0,&local_8a8,1,&local_8a8,&secp256k1_scalar_one,&local_8e0);
    iVar1 = 0;
    if (local_8a8.infinity == 0) {
      secp256k1_ge_set_gej(p,&local_8a8);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}